

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

size_t propagatemark(global_State *g)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  global_State *g_00;
  long in_RDI;
  GCtab *unaff_retaddr;
  global_State *in_stack_00000008;
  GCtrace *T;
  lua_State *th;
  GCproto *pt;
  GCfunc *fn;
  GCtab *t;
  int gct;
  GCobj *o;
  GCfunc *in_stack_ffffffffffffffa8;
  global_State *in_stack_ffffffffffffffb0;
  lua_State *in_stack_ffffffffffffffb8;
  global_State *in_stack_ffffffffffffffc0;
  ulong local_8;
  
  uVar2 = *(uint *)(in_RDI + 0x38);
  g_00 = (global_State *)(ulong)uVar2;
  cVar1 = *(char *)((long)&g_00->strhash + 5);
  *(byte *)((long)&g_00->strhash + 4) = *(byte *)((long)&g_00->strhash + 4) | 4;
  *(MSize *)(in_RDI + 0x38) = g_00->strnum;
  if (cVar1 == '\v') {
    iVar3 = gc_traverse_tab(in_stack_00000008,unaff_retaddr);
    if (0 < iVar3) {
      *(byte *)((long)&g_00->strhash + 4) = *(byte *)((long)&g_00->strhash + 4) & 0xfb;
    }
    local_8 = (ulong)*(uint *)&g_00->allocd * 8 + 0x20 +
              (ulong)(*(int *)((long)&g_00->allocd + 4) + 1) * 0x18;
  }
  else if (cVar1 == '\b') {
    gc_traverse_func(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (*(char *)((long)&g_00->strhash + 6) == '\0') {
      local_8 = (ulong)*(byte *)((long)&g_00->strhash + 7) * 4 + 0x14;
    }
    else {
      local_8 = (ulong)*(byte *)((long)&g_00->strhash + 7) * 8 + 0x20;
    }
  }
  else if (cVar1 == '\a') {
    gc_traverse_proto(in_stack_ffffffffffffffb0,(GCproto *)&in_stack_ffffffffffffffa8->c);
    local_8 = (ulong)(g_00->gc).total;
  }
  else if (cVar1 == '\x06') {
    g_00->strnum = *(MSize *)(in_RDI + 0x3c);
    *(uint *)(in_RDI + 0x3c) = uVar2;
    *(byte *)((long)&g_00->strhash + 4) = *(byte *)((long)&g_00->strhash + 4) & 0xfb;
    gc_traverse_thread(g_00,in_stack_ffffffffffffffb8);
    local_8 = (ulong)(g_00->gc).gray.gcptr32 * 8 + 0x40;
  }
  else {
    gc_traverse_trace(in_stack_ffffffffffffffc0,(GCtrace *)g_00);
    local_8 = (ulong)(g_00->strmask - *(int *)&g_00->allocd) * 8 + 0x60 +
              (ulong)*(ushort *)((long)&g_00->allocd + 4) * 8 +
              (ulong)*(ushort *)((long)&g_00->allocd + 6) * 4;
  }
  return local_8;
}

Assistant:

static size_t propagatemark(global_State *g)
{
  GCobj *o = gcref(g->gc.gray);
  int gct = o->gch.gct;
  lua_assert(isgray(o));
  gray2black(o);
  setgcrefr(g->gc.gray, o->gch.gclist);  /* Remove from gray list. */
  if (LJ_LIKELY(gct == ~LJ_TTAB)) {
    GCtab *t = gco2tab(o);
    if (gc_traverse_tab(g, t) > 0)
      black2gray(o);  /* Keep weak tables gray. */
    return sizeof(GCtab) + sizeof(TValue) * t->asize +
			   sizeof(Node) * (t->hmask + 1);
  } else if (LJ_LIKELY(gct == ~LJ_TFUNC)) {
    GCfunc *fn = gco2func(o);
    gc_traverse_func(g, fn);
    return isluafunc(fn) ? sizeLfunc((MSize)fn->l.nupvalues) :
			   sizeCfunc((MSize)fn->c.nupvalues);
  } else if (LJ_LIKELY(gct == ~LJ_TPROTO)) {
    GCproto *pt = gco2pt(o);
    gc_traverse_proto(g, pt);
    return pt->sizept;
  } else if (LJ_LIKELY(gct == ~LJ_TTHREAD)) {
    lua_State *th = gco2th(o);
    setgcrefr(th->gclist, g->gc.grayagain);
    setgcref(g->gc.grayagain, o);
    black2gray(o);  /* Threads are never black. */
    gc_traverse_thread(g, th);
    return sizeof(lua_State) + sizeof(TValue) * th->stacksize;
  } else {
#if LJ_HASJIT
    GCtrace *T = gco2trace(o);
    gc_traverse_trace(g, T);
    return ((sizeof(GCtrace)+7)&~7) + (T->nins-T->nk)*sizeof(IRIns) +
	   T->nsnap*sizeof(SnapShot) + T->nsnapmap*sizeof(SnapEntry);
#else
    lua_assert(0);
    return 0;
#endif
  }
}